

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

void update_piecewise_linear_residual
               (aom_noise_strength_solver_t *solver,aom_noise_strength_lut_t *lut,double *residual,
               int start,int end)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double (*padVar5) [2];
  double dVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double range;
  int n;
  
  uVar8 = 1;
  if (1 < start) {
    uVar8 = start;
  }
  uVar9 = lut->num_points - 1;
  if (end <= (int)uVar9) {
    uVar9 = end;
  }
  if ((int)uVar8 < (int)uVar9) {
    iVar4 = solver->num_bins;
    padVar5 = lut->points;
    dVar15 = (double)(iVar4 + -1);
    uVar11 = (ulong)uVar8;
    do {
      dVar2 = padVar5[uVar11 - 1][0];
      dVar3 = solver->min_intensity;
      dVar13 = solver->max_intensity;
      dVar12 = dVar13;
      if (dVar2 <= dVar13) {
        dVar12 = dVar2;
      }
      dVar14 = dVar13 - dVar3;
      dVar12 = floor((((double)(-(ulong)(dVar2 < dVar3) & (ulong)dVar3 |
                               ~-(ulong)(dVar2 < dVar3) & (ulong)dVar12) - dVar3) * dVar15) / dVar14
                    );
      uVar8 = (int)dVar12;
      if ((int)dVar12 < 1) {
        uVar8 = 0;
      }
      uVar1 = uVar11 + 1;
      dVar12 = padVar5[uVar1][0];
      if (dVar12 <= dVar13) {
        dVar13 = dVar12;
      }
      dVar13 = ceil((((double)(-(ulong)(dVar12 < dVar3) & (ulong)dVar3 |
                              ~-(ulong)(dVar12 < dVar3) & (ulong)dVar13) - dVar3) * dVar15) / dVar14
                   );
      iVar7 = (int)dVar13;
      if (iVar4 <= (int)dVar13) {
        iVar7 = iVar4 + -1;
      }
      dVar13 = 0.0;
      if ((int)uVar8 <= iVar7) {
        uVar10 = (ulong)uVar8;
        dVar13 = 0.0;
        do {
          dVar6 = ((double)(int)uVar10 / dVar15) * dVar14 + dVar3;
          if ((dVar2 <= dVar6) && (dVar6 < dVar12)) {
            dVar6 = (dVar6 - dVar2) / (dVar12 - dVar2);
            dVar13 = dVar13 + ABS((solver->eqns).x[uVar10] -
                                  ((1.0 - dVar6) * padVar5[uVar11 - 1][1] +
                                  dVar6 * padVar5[uVar1][1]));
          }
          uVar10 = uVar10 + 1;
        } while (iVar7 + 1 != uVar10);
      }
      residual[uVar11] = dVar13 * (255.0 / (double)iVar4);
      uVar11 = uVar1;
    } while (uVar1 != uVar9);
  }
  return;
}

Assistant:

static void update_piecewise_linear_residual(
    const aom_noise_strength_solver_t *solver,
    const aom_noise_strength_lut_t *lut, double *residual, int start, int end) {
  const double dx = 255. / solver->num_bins;
  for (int i = AOMMAX(start, 1); i < AOMMIN(end, lut->num_points - 1); ++i) {
    const int lower = AOMMAX(0, (int)floor(noise_strength_solver_get_bin_index(
                                    solver, lut->points[i - 1][0])));
    const int upper = AOMMIN(solver->num_bins - 1,
                             (int)ceil(noise_strength_solver_get_bin_index(
                                 solver, lut->points[i + 1][0])));
    double r = 0;
    for (int j = lower; j <= upper; ++j) {
      const double x = aom_noise_strength_solver_get_center(solver, j);
      if (x < lut->points[i - 1][0]) continue;
      if (x >= lut->points[i + 1][0]) continue;
      const double y = solver->eqns.x[j];
      const double a = (x - lut->points[i - 1][0]) /
                       (lut->points[i + 1][0] - lut->points[i - 1][0]);
      const double estimate_y =
          lut->points[i - 1][1] * (1.0 - a) + lut->points[i + 1][1] * a;
      r += fabs(y - estimate_y);
    }
    residual[i] = r * dx;
  }
}